

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O1

int pt_qry_event(pt_query_decoder *decoder,pt_event *uev,size_t size)

{
  pt_event *uev_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint8_t uVar7;
  undefined7 uVar8;
  int iVar9;
  uint uVar10;
  pt_event *ev;
  
  uVar10 = 0xfffffffe;
  if (0x27 < size && (uev != (pt_event *)0x0 && decoder != (pt_query_decoder *)0x0)) {
    iVar9 = pt_tnt_cache_is_empty(&decoder->tnt);
    uVar10 = 0xfffffff8;
    if (((iVar9 != 0) && (uVar10 = decoder->status, -1 < (int)uVar10)) &&
       (uVar10 = 0xfffffff8, ((decoder->event).type & ~ptev_disabled) != ptev_tip)) {
      uev_00 = &decoder->event;
      if (0x47 < size) {
        size = 0x48;
      }
      memcpy(uev,uev_00,size);
      uVar1 = (decoder->evdec).time.base;
      uVar2 = (decoder->evdec).time.fc;
      uVar3 = (decoder->evdec).time.ctc;
      uVar4 = (decoder->evdec).time.ctc_cyc;
      uVar5 = (decoder->evdec).time.lost_mtc;
      uVar6 = (decoder->evdec).time.lost_cyc;
      uVar7 = (decoder->evdec).time.cbr;
      uVar8 = *(undefined7 *)&(decoder->evdec).time.field_0x29;
      (decoder->last_time).tsc = (decoder->evdec).time.tsc;
      (decoder->last_time).base = uVar1;
      (decoder->last_time).fc = uVar2;
      (decoder->last_time).ctc = uVar3;
      (decoder->last_time).ctc_cyc = uVar4;
      (decoder->last_time).lost_mtc = uVar5;
      (decoder->last_time).lost_cyc = uVar6;
      (decoder->last_time).cbr = uVar7;
      *(undefined7 *)&(decoder->last_time).field_0x29 = uVar8;
      iVar9 = pt_evt_next(&decoder->evdec,uev_00,0x48);
      if (iVar9 < 0) {
        decoder->status = iVar9;
        (decoder->event).variant.mwait.hints = 0xffffffff;
        (decoder->event).variant.mwait.ext = 0xffffffff;
        *(undefined4 *)((long)&(decoder->event).variant + 0x10) = 0xffffffff;
        *(undefined4 *)((long)&(decoder->event).variant + 0x14) = 0xffffffff;
        *(undefined4 *)((decoder->event).reserved + 1) = 0xffffffff;
        *(undefined4 *)((long)(decoder->event).reserved + 0xc) = 0xffffffff;
        (decoder->event).variant.exec_mode.mode = ~ptem_unknown;
        *(undefined4 *)((long)&(decoder->event).variant + 4) = 0xffffffff;
        (decoder->event).lost_mtc = 0xffffffff;
        (decoder->event).lost_cyc = 0xffffffff;
        *(undefined4 *)(decoder->event).reserved = 0xffffffff;
        *(undefined4 *)((long)(decoder->event).reserved + 4) = 0xffffffff;
        uev_00->type = ~ptev_enabled;
        *(undefined4 *)&(decoder->event).field_0x4 = 0xffffffff;
        *(undefined4 *)&(decoder->event).tsc = 0xffffffff;
        *(undefined4 *)((long)&(decoder->event).tsc + 4) = 0xffffffff;
        (decoder->event).variant.vmexit.ip = 0xffffffffffffffff;
      }
      iVar9 = pt_tnt_cache_is_empty(&decoder->tnt);
      if (iVar9 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = 4;
        if (decoder->status != -7) {
          uVar10 = (uint)((uev_00->type & ~ptev_disabled) != ptev_tip);
        }
      }
    }
  }
  return uVar10;
}

Assistant:

int pt_qry_event(struct pt_query_decoder *decoder, struct pt_event *uev,
		 size_t size)
{
	const struct pt_event *ev;
	int errcode, status;

	if (!decoder || !uev)
		return -pte_invalid;

	if (size < offsetof(struct pt_event, variant))
		return -pte_invalid;

	/* We do not allow querying for events while there are still TNT
	 * bits to consume.
	 */
	if (!pt_tnt_cache_is_empty(&decoder->tnt))
		return -pte_bad_query;

	/* Report any deferred error. */
	errcode = decoder->status;
	if (errcode < 0)
		return errcode;

	ev = &decoder->event;

	status = pt_qry_event_pending(ev);
	if (status <= 0) {
		if (status < 0)
			return status;

		return -pte_bad_query;
	}

	/* Copy the event to the user.  Make sure we're not writing beyond the
	 * memory provided by the user.
	 *
	 * We might truncate details of an event but only for those events the
	 * user can't know about, anyway.
	 */
	if (sizeof(*uev) < size)
		size = sizeof(*uev);

	memcpy(uev, ev, size);

	/* Preserve the time at the event. */
	decoder->last_time = decoder->evdec.time;

	errcode = pt_qry_fetch_event(decoder);
	if (errcode < 0)
		return errcode;

	return pt_qry_status_flags(decoder);
}